

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::emplaceRealloc<slang::parsing::Trivia>
          (SmallVectorBase<slang::parsing::Trivia> *this,pointer pos,Trivia *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  undefined8 uVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar3 = this->cap;
  if (uVar10 < uVar3 * 2) {
    uVar10 = uVar3 * 2;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    uVar10 = 0x7ffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pTVar7 = (pointer)operator_new(uVar10 << 4);
  uVar4 = *(undefined8 *)((long)&args->field_0 + 8);
  *(undefined8 *)((long)pTVar7 + lVar11) = (args->field_0).rawText.ptr;
  ((undefined8 *)((long)pTVar7 + lVar11))[1] = uVar4;
  p = this->data_;
  lVar8 = this->len * 0x10;
  lVar9 = (long)p + (lVar8 - (long)pos);
  pTVar5 = p;
  pTVar6 = pTVar7;
  if (lVar9 == 0) {
    if (this->len != 0) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->field_0 + lVar9);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pTVar7->field_0 + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 != lVar9);
    }
  }
  else {
    for (; pTVar5 != pos; pTVar5 = pTVar5 + 1) {
      uVar4 = *(undefined8 *)((long)&pTVar5->field_0 + 8);
      (pTVar6->field_0).rawText.ptr = (pTVar5->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar6->field_0 + 8) = uVar4;
      pTVar6 = pTVar6 + 1;
    }
    memcpy((void *)((long)pTVar7 + lVar11 + 0x10),pos,(lVar9 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar10;
  this->data_ = pTVar7;
  return (pointer)((long)pTVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}